

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O2

char * __thiscall
Memory::LargeHeapBucket::TryAllocFromFreeList
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,ObjectInfoBits attributes)

{
  LargeHeapBlockFreeList *pLVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  char *pcVar5;
  LargeHeapBlockFreeList **ppLVar6;
  
  if (InternalObjectInfoBitMask < attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x178,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  ppLVar6 = &this->freeList;
  while( true ) {
    pLVar1 = *ppLVar6;
    if (pLVar1 == (LargeHeapBlockFreeList *)0x0) {
      return (char *)0x0;
    }
    pcVar5 = LargeHeapBlock::TryAllocFromFreeList(pLVar1->heapBlock,sizeCat,attributes);
    if (pcVar5 != (char *)0x0) break;
    if ((recycler->recyclerFlagsTable->Verbose == true) &&
       ((bVar3 = Js::Phases::IsEnabled(&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase),
        bVar3 || (bVar3 = Js::Phases::IsEnabled
                                    (&recycler->recyclerFlagsTable->Trace,LargeMemoryAllocationPhase
                                    ), bVar3)))) {
      Output::Print(L"Unable to allocate object of size 0x%x from freelist\n",sizeCat);
    }
    ppLVar6 = &pLVar1->next;
  }
  return pcVar5;
}

Assistant:

char *
LargeHeapBucket::TryAllocFromFreeList(Recycler * recycler, size_t sizeCat, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    LargeHeapBlockFreeList* freeListEntry = this->freeList;

    // Walk through the free list, find the first entry that can fit our desired size
    while (freeListEntry)
    {
        LargeHeapBlock* heapBlock = freeListEntry->heapBlock;

        char * memBlock = heapBlock->TryAllocFromFreeList(sizeCat, attributes);
        if (memBlock)
        {
            // Don't need to verify zero fill here since we will do it in LargeHeapBucket::Alloc
            return memBlock;
        }
        else
        {
#if DBG
            LargeAllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Unable to allocate object of size 0x%x from freelist\n"), sizeCat);
#endif
        }

        freeListEntry = freeListEntry->next;
    }
    return nullptr;
}